

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

const_buffers_1 asio::buffer(const_buffer *b,size_t max_size_in_bytes)

{
  void *data;
  size_t sVar1;
  size_t local_38;
  size_t max_size_in_bytes_local;
  const_buffer *b_local;
  
  data = const_buffer::data(b);
  sVar1 = const_buffer::size(b);
  local_38 = max_size_in_bytes;
  if (sVar1 < max_size_in_bytes) {
    local_38 = const_buffer::size(b);
  }
  const_buffers_1::const_buffers_1((const_buffers_1 *)&b_local,data,local_38);
  return (const_buffers_1)_b_local;
}

Assistant:

inline ASIO_CONST_BUFFER buffer(const const_buffer& b,
    std::size_t max_size_in_bytes) ASIO_NOEXCEPT
{
  return ASIO_CONST_BUFFER(b.data(),
      b.size() < max_size_in_bytes
      ? b.size() : max_size_in_bytes
#if defined(ASIO_ENABLE_BUFFER_DEBUGGING)
      , b.get_debug_check()
#endif // ASIO_ENABLE_BUFFER_DEBUGGING
      );
}